

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<int>::appendIteratorRange<int_const*>
          (QCommonArrayOps<int> *this,int *b,int *e,IfIsForwardIterator<const_int_*> param_4)

{
  int *piVar1;
  undefined1 in_CL;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int *iter;
  qsizetype distance;
  QArrayDataPointer<int> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  int *local_10;
  
  std::distance<int_const*>
            (in_RDX,(int *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
  piVar1 = QArrayDataPointer<int>::end(in_stack_ffffffffffffffd0);
  for (local_10 = in_RSI; local_10 != in_RDX; local_10 = local_10 + 1) {
    *piVar1 = *local_10;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    piVar1 = piVar1 + 1;
  }
  return;
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }